

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

void __thiscall mkvparser::Tracks::~Tracks(Tracks *this)

{
  Track **ppTVar1;
  Track **ppTVar2;
  
  ppTVar1 = this->m_trackEntriesEnd;
  for (ppTVar2 = this->m_trackEntries; ppTVar2 != ppTVar1; ppTVar2 = ppTVar2 + 1) {
    if (*ppTVar2 != (Track *)0x0) {
      (*(*ppTVar2)->_vptr_Track[1])();
    }
  }
  if (this->m_trackEntries != (Track **)0x0) {
    operator_delete__(this->m_trackEntries);
    return;
  }
  return;
}

Assistant:

Tracks::~Tracks() {
  Track** i = m_trackEntries;
  Track** const j = m_trackEntriesEnd;

  while (i != j) {
    Track* const pTrack = *i++;
    delete pTrack;
  }

  delete[] m_trackEntries;
}